

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLoader.c
# Opt level: O0

void FileLoader_dfree(void *context)

{
  FILE_LOADER *loader;
  void *context_local;
  
  free(*(void **)((long)context + 0x10));
  free(context);
  return;
}

Assistant:

static void FileLoader_dfree(void *context)
{
	FILE_LOADER *loader = (FILE_LOADER *)context;
#if HAVE_FILELOADER_W
	if (loader->fileName == NULL)
		free(loader->fileNameW);
#endif
	free(loader->fileName);
	free(loader);
}